

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void __thiscall FM::OPNA::SetVolumeADPCM(OPNA *this,int db)

{
  int iVar1;
  double dVar2;
  
  iVar1 = 0;
  if (-0xc0 < db) {
    iVar1 = 0x14;
    if (db < 0x14) {
      iVar1 = db;
    }
    dVar2 = pow(10.0,(double)iVar1 / 40.0);
    iVar1 = (int)(dVar2 * 65536.0);
  }
  (this->super_OPNABase).adpcmvol = iVar1;
  (this->super_OPNABase).adpcmvolume = iVar1 * (this->super_OPNABase).adpcmlevel >> 0xc;
  return;
}

Assistant:

void OPNA::SetVolumeADPCM(int db)
{
	db = Min(db, 20);
	if (db > -192)
		adpcmvol = int(65536.0 * pow(10.0, db / 40.0));
	else
		adpcmvol = 0;

	adpcmvolume = (adpcmvol * adpcmlevel) >> 12;
}